

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minunit.h
# Opt level: O2

double mu_timer_real(void)

{
  int iVar1;
  double dVar2;
  timeval tm;
  
  iVar1 = clock_gettime(4,(timespec *)&tm);
  if (iVar1 == -1) {
    gettimeofday((timeval *)&tm,(__timezone_ptr_t)0x0);
    dVar2 = (double)tm.tv_usec / 1000000.0;
  }
  else {
    dVar2 = (double)tm.tv_usec / 1000000000.0;
  }
  return dVar2 + (double)tm.tv_sec;
}

Assistant:

static double mu_timer_real(void) {
#if defined(_WIN32)
  /* Windows 2000 and later. ---------------------------------- */
  LARGE_INTEGER Time;
  LARGE_INTEGER Frequency;

  QueryPerformanceFrequency(&Frequency);
  QueryPerformanceCounter(&Time);

  Time.QuadPart *= 1000000;
  Time.QuadPart /= Frequency.QuadPart;

  return (double)Time.QuadPart / 1000000.0;

#elif (defined(__hpux) || defined(hpux)) ||                                    \
    ((defined(__sun__) || defined(__sun) || defined(sun)) &&                   \
     (defined(__SVR4) || defined(__svr4__)))
  /* HP-UX, Solaris. ------------------------------------------ */
  return (double)gethrtime() / 1000000000.0;

#elif defined(__MACH__) && defined(__APPLE__)
  /* OSX. ----------------------------------------------------- */
  static double timeConvert = 0.0;
  if (timeConvert == 0.0) {
    mach_timebase_info_data_t timeBase;
    (void)mach_timebase_info(&timeBase);
    timeConvert =
        (double)timeBase.numer / (double)timeBase.denom / 1000000000.0;
  }
  return (double)mach_absolute_time() * timeConvert;

#elif defined(_POSIX_VERSION)
  /* POSIX. --------------------------------------------------- */
  struct timeval tm;
#if defined(_POSIX_TIMERS) && (_POSIX_TIMERS > 0)
  {
    struct timespec ts;
#if defined(CLOCK_MONOTONIC_PRECISE)
    /* BSD. --------------------------------------------- */
    const clockid_t id = CLOCK_MONOTONIC_PRECISE;
#elif defined(CLOCK_MONOTONIC_RAW)
    /* Linux. ------------------------------------------- */
    const clockid_t id = CLOCK_MONOTONIC_RAW;
#elif defined(CLOCK_HIGHRES)
    /* Solaris. ----------------------------------------- */
    const clockid_t id = CLOCK_HIGHRES;
#elif defined(CLOCK_MONOTONIC)
    /* AIX, BSD, Linux, POSIX, Solaris. ----------------- */
    const clockid_t id = CLOCK_MONOTONIC;
#elif defined(CLOCK_REALTIME)
    /* AIX, BSD, HP-UX, Linux, POSIX. ------------------- */
    const clockid_t id = CLOCK_REALTIME;
#else
    const clockid_t id = (clockid_t)-1; /* Unknown. */
#endif /* CLOCK_* */
    if (id != (clockid_t)-1 && clock_gettime(id, &ts) != -1)
      return (double)ts.tv_sec + (double)ts.tv_nsec / 1000000000.0;
    /* Fall thru. */
  }
#endif /* _POSIX_TIMERS */

  /* AIX, BSD, Cygwin, HP-UX, Linux, OSX, POSIX, Solaris. ----- */
  gettimeofday(&tm, NULL);
  return (double)tm.tv_sec + (double)tm.tv_usec / 1000000.0;
#else
  return -1.0; /* Failed. */
#endif
}